

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int openDirectory(char *zFilename,int *pFd)

{
  int iVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  bool bVar3;
  int local_234;
  int fd;
  int ii;
  int *pFd_local;
  char *zFilename_local;
  char local_218 [8];
  char zDirname [513];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  sqlite3_snprintf(0x200,local_218,"%s",zFilename);
  sVar2 = strlen(local_218);
  local_234 = (int)sVar2;
  while( true ) {
    bVar3 = false;
    if (0 < local_234) {
      bVar3 = local_218[local_234] != '/';
    }
    if (!bVar3) break;
    local_234 = local_234 + -1;
  }
  if (local_234 < 1) {
    if (local_218[0] != '/') {
      local_218[0] = '.';
    }
    local_218[1] = 0;
  }
  else {
    local_218[local_234] = '\0';
  }
  iVar1 = robust_open(local_218,0,0);
  *pFd = iVar1;
  if (iVar1 < 0) {
    iVar1 = sqlite3CantopenError(0x9918);
    zFilename_local._4_4_ = unixLogErrorAtLine(iVar1,"openDirectory",local_218,0x9918);
  }
  else {
    zFilename_local._4_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
    return zFilename_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>0 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
  }else{
    if( zDirname[0]!='/' ) zDirname[0] = '.';
    zDirname[1] = 0;
  }
  fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
  if( fd>=0 ){
    OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
  }
  *pFd = fd;
  if( fd>=0 ) return SQLITE_OK;
  return unixLogError(SQLITE_CANTOPEN_BKPT, "openDirectory", zDirname);
}